

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.tab.cpp
# Opt level: O2

int yysyntax_error(long *yymsg_alloc,char **yymsg,yypcontext_t *yyctx)

{
  char cVar1;
  yysymbol_kind_t yVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  char *__s;
  int iVar8;
  short *psVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  char *yyres;
  int iVar13;
  long lVar14;
  yysymbol_kind_t yyarg [5];
  
  yVar2 = yyctx->yytoken;
  __s = "syntax error";
  uVar11 = 0;
  if (yVar2 == YYSYMBOL_YYEMPTY) {
    uVar10 = 0;
  }
  else {
    iVar13 = (int)yypact[*yyctx->yyssp];
    uVar10 = 1;
    yyarg[0] = yVar2;
    if (iVar13 != -0x7f) {
      uVar12 = (ulong)iVar13;
      iVar8 = 0x2c;
      if (0x126 - iVar13 < 0x2c) {
        iVar8 = 0x126 - iVar13;
      }
      uVar3 = 0;
      uVar6 = -uVar12;
      if (-1 < yypact[*yyctx->yyssp]) {
        uVar6 = uVar3;
      }
      if ((long)uVar12 < 1) {
        uVar12 = uVar3;
      }
      psVar9 = yycheck + uVar12;
      for (; iVar13 = (int)uVar3, (long)uVar6 < (long)iVar8; uVar6 = uVar6 + 1) {
        if ((uVar6 != 1) && ((yysymbol_kind_t)uVar6 == (int)*psVar9)) {
          if (iVar13 == 4) {
            __s = "syntax error, unexpected %s";
            goto switchD_0010d44a_caseD_fffffffe;
          }
          uVar3 = (ulong)(iVar13 + 1);
          yyarg[(long)iVar13 + 1] = (int)*psVar9;
        }
        psVar9 = psVar9 + 1;
      }
      if (iVar13 == -2) {
        return -2;
      }
      if (iVar13 != 0) {
        uVar10 = iVar13 + 1;
        switch(iVar13) {
        case 1:
          __s = "syntax error, unexpected %s, expecting %s";
          uVar10 = 2;
          break;
        case 2:
          __s = "syntax error, unexpected %s, expecting %s or %s";
          uVar10 = 3;
          break;
        case 3:
          __s = "syntax error, unexpected %s, expecting %s or %s or %s";
          uVar10 = 4;
          break;
        case 4:
          __s = "syntax error, unexpected %s, expecting %s or %s or %s or %s";
          uVar10 = 5;
          break;
        case -3:
          return -2;
        }
        goto switchD_0010d44a_caseD_fffffffe;
      }
    }
    yyarg[1] = YYSYMBOL_YYEMPTY;
    __s = "syntax error, unexpected %s";
  }
switchD_0010d44a_caseD_fffffffe:
  sVar4 = strlen(__s);
  lVar14 = (sVar4 - (long)(int)(uVar10 * 2)) + 1;
  uVar12 = 0;
  if (0 < (int)uVar10) {
    uVar12 = (ulong)uVar10;
  }
  for (; uVar12 != uVar11; uVar11 = uVar11 + 1) {
    lVar5 = yytnamerr((char *)0x0,yytname[yyarg[uVar11]]);
    if (lVar5 < 0) {
      return -2;
    }
    lVar14 = lVar14 + lVar5;
  }
  if (*yymsg_alloc < lVar14) {
    lVar5 = lVar14 * 2;
    lVar7 = 0x7fffffffffffffff;
    if (lVar14 == lVar5 || SBORROW8(lVar14,lVar5) != 0 < lVar14) {
      lVar7 = lVar5;
    }
    *yymsg_alloc = lVar7;
    return -1;
  }
  yyres = *yymsg;
  iVar13 = 0;
  lVar14 = 1;
  do {
    cVar1 = *__s;
    *yyres = cVar1;
    lVar5 = lVar14;
    lVar7 = lVar14;
    if (cVar1 == '%') {
      if ((__s[1] == 's') && (iVar13 < (int)uVar10)) {
        lVar5 = (long)iVar13;
        iVar13 = iVar13 + 1;
        lVar5 = yytnamerr(yyres,yytname[yyarg[lVar5]]);
        lVar7 = 2;
      }
    }
    else if (cVar1 == '\0') {
      return 0;
    }
    yyres = yyres + lVar5;
    __s = __s + lVar7;
  } while( true );
}

Assistant:

static int
yy_syntax_error_arguments (const yypcontext_t *yyctx,
                           yysymbol_kind_t yyarg[], int yyargn)
{
  /* Actual size of YYARG. */
  int yycount = 0;
  /* There are many possibilities here to consider:
     - If this state is a consistent state with a default action, then
       the only way this function was invoked is if the default action
       is an error action.  In that case, don't check for expected
       tokens because there are none.
     - The only way there can be no lookahead present (in yychar) is if
       this state is a consistent state with a default action.  Thus,
       detecting the absence of a lookahead is sufficient to determine
       that there is no unexpected or expected token to report.  In that
       case, just report a simple "syntax error".
     - Don't assume there isn't a lookahead just because this state is a
       consistent state with a default action.  There might have been a
       previous inconsistent state, consistent state with a non-default
       action, or user semantic action that manipulated yychar.
     - Of course, the expected token list depends on states to have
       correct lookahead information, and it depends on the parser not
       to perform extra reductions after fetching a lookahead from the
       scanner and before detecting a syntax error.  Thus, state merging
       (from LALR or IELR) and default reductions corrupt the expected
       token list.  However, the list is correct for canonical LR with
       one exception: it will still contain any token that will not be
       accepted due to an error action in a later state.
  */
  if (yyctx->yytoken != YYSYMBOL_YYEMPTY)
    {
      int yyn;
      if (yyarg)
        yyarg[yycount] = yyctx->yytoken;
      ++yycount;
      yyn = yypcontext_expected_tokens (yyctx,
                                        yyarg ? yyarg + 1 : yyarg, yyargn - 1);
      if (yyn == YYENOMEM)
        return YYENOMEM;
      else
        yycount += yyn;
    }
  return yycount;
}